

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  getattrfunc p_Var1;
  byte bVar2;
  ushort uVar3;
  pointer paVar4;
  bool bVar5;
  uint __val;
  char *pcVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long *plVar12;
  undefined8 *puVar13;
  type_info *ptVar14;
  detail *pdVar15;
  PyMethodDef *pPVar16;
  object *poVar17;
  PyObject *pPVar18;
  PyObject *pPVar19;
  function_record *pfVar20;
  error_already_set *this_00;
  ushort uVar21;
  PyTypeObject *pPVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  function_record *pfVar25;
  size_type *psVar26;
  long *plVar27;
  char *text_00;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  freefunc p_Var28;
  char cVar29;
  undefined8 uVar30;
  getattrfunc p_Var31;
  uint __len;
  long lVar32;
  function_record *pfVar33;
  uint uVar34;
  pointer paVar35;
  function_record *pfVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  string class_name;
  string name;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  function_record *local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [39];
  allocator<char> local_141;
  PyBufferProcs *local_140;
  type_info **local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  char *local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  strdup_guard local_e8;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_d0;
  undefined1 local_c8 [16];
  char *local_b8;
  handle local_b0;
  unique_function_record *local_a8;
  freefunc local_a0;
  str local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar33 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar11 = "";
  if (pfVar33->name != (char *)0x0) {
    pcVar11 = pfVar33->name;
  }
  local_140 = (PyBufferProcs *)this;
  local_138 = types;
  local_a0 = (freefunc)args;
  pcVar11 = strdup_guard::operator()(&local_e8,pcVar11);
  pfVar33->name = pcVar11;
  if (pfVar33->doc != (char *)0x0) {
    pcVar11 = strdup_guard::operator()(&local_e8,pfVar33->doc);
    pfVar33->doc = pcVar11;
  }
  paVar35 = (pfVar33->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = *(pointer *)
            ((long)&(pfVar33->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  local_190 = pfVar33;
  local_a8 = unique_rec;
  if (paVar35 != paVar4) {
    do {
      if (*(char **)paVar35 != (char *)0x0) {
        pcVar11 = strdup_guard::operator()(&local_e8,*(char **)paVar35);
        *(char **)paVar35 = pcVar11;
      }
      if (*(char **)(paVar35 + 8) == (char *)0x0) {
        if (*(long *)(paVar35 + 0x10) != 0) {
          auVar38 = PyObject_Repr();
          if (auVar38._0_8_ == (getiterfunc)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_108._0_8_ = auVar38._0_8_;
          cast<std::__cxx11::string>
                    ((enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_1f0,(pybind11 *)local_108,auVar38._8_8_);
          pcVar11 = strdup_guard::operator()(&local_e8,(char *)local_1f0._0_8_);
          *(char **)(paVar35 + 8) = pcVar11;
          if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
          }
          pybind11::handle::dec_ref((handle *)local_108);
        }
      }
      else {
        pcVar11 = strdup_guard::operator()(&local_e8,*(char **)(paVar35 + 8));
        *(char **)(paVar35 + 8) = pcVar11;
      }
      paVar35 = paVar35 + 0x20;
    } while (paVar35 != paVar4);
  }
  pfVar33 = local_190;
  pcVar11 = local_190->name;
  iVar9 = strcmp(pcVar11,"__init__");
  if (iVar9 == 0) {
    uVar21 = 1;
  }
  else {
    iVar9 = strcmp(pcVar11,"__setstate__");
    uVar21 = (ushort)(iVar9 == 0);
  }
  uVar3 = *(ushort *)&pfVar33->field_0x59;
  *(ushort *)&pfVar33->field_0x59 = uVar3 & 0xfffe | uVar21;
  if (((uVar3 & 2) == 0 & (byte)uVar21) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,(char *)(pfVar33->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,pfVar33->name,(allocator<char> *)&local_1d0);
    uVar30 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    plVar12 = (long *)std::__cxx11::string::append(local_130);
    pPVar22 = (PyTypeObject *)(plVar12 + 2);
    if ((PyTypeObject *)*plVar12 == pPVar22) {
      local_188._16_8_ = (pPVar22->ob_base).ob_base.ob_refcnt;
      local_188._24_8_ = plVar12[3];
      local_188._0_8_ = (PyTypeObject *)(local_188 + 0x10);
    }
    else {
      local_188._16_8_ = (pPVar22->ob_base).ob_base.ob_refcnt;
      local_188._0_8_ = (PyTypeObject *)*plVar12;
    }
    local_188._8_8_ = plVar12[1];
    *plVar12 = (long)pPVar22;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append(local_188,local_108._0_8_);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar23) {
      local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1b0.field_2._8_8_ = plVar12[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1b0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_1b0._M_string_length = plVar12[1];
    *plVar12 = (long)paVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar23) {
      local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1d0.field_2._8_8_ = puVar13[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1d0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1d0._M_string_length = puVar13[1];
    *puVar13 = paVar23;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    PyErr_WarnEx(uVar30,local_1d0._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    pfVar33 = local_190;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
    }
    if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((undefined1 *)local_130._0_8_ != local_120) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_120._0_8_ + 1));
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,
                      CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
    }
    if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
    }
  }
  local_d0 = &pfVar33->args;
  local_108._0_8_ = local_108 + 0x10;
  local_108._8_8_ = (iternextfunc)0x0;
  local_f8._M_local_buf[0] = '\0';
  local_110 = local_1e0;
  bVar5 = false;
  p_Var28 = (freefunc)0x0;
  lVar32 = 0;
  do {
    bVar2 = *text;
    if (bVar2 < 0x7b) {
      if (bVar2 == 0x25) {
        pPVar22 = (PyTypeObject *)local_138[lVar32];
        if (pPVar22 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1f0._0_8_ = pPVar22;
        ptVar14 = detail::get_type_info((type_index *)local_1f0,false);
        lVar32 = lVar32 + 1;
        if (ptVar14 == (type_info *)0x0) {
          if (((local_190->field_0x59 & 2) == 0) || (p_Var28 != (freefunc)0x0)) {
            pPVar22 = (pPVar22->ob_base).ob_base.ob_type;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,
                       (char *)((long)&(pPVar22->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar22->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)&local_1b0);
            detail::clean_type_id(&local_1d0);
            local_1f0._0_8_ = local_1e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1f0,local_1d0._M_dataplus._M_p,
                       (char *)(local_1d0._M_string_length + (long)local_1d0._M_dataplus._M_p));
            std::__cxx11::string::_M_append(local_108,local_1f0._0_8_);
            if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
              operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_001362b3;
          }
          local_130._8_8_ = (local_190->scope).m_ptr;
          local_120._0_8_ = "__module__";
          local_120._8_8_ = (richcmpfunc)0x0;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_130)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar15,handle_00);
          local_188._0_8_ = local_188 + 0x10;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_188._24_8_ = local_1e0._8_8_;
          }
          else {
            local_188._0_8_ = local_1f0._0_8_;
          }
          local_188._16_8_ = local_1e0._0_8_;
          local_188._8_8_ = local_1f0._8_8_;
          plVar12 = (long *)std::__cxx11::string::append(local_188);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar23) {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1b0.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1b0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1b0._M_string_length = plVar12[1];
          *plVar12 = (long)paVar23;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_c8._8_8_ = (local_190->scope).m_ptr;
          local_b8 = "__qualname__";
          local_b0.m_ptr = (PyObject *)0x0;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar15,handle_02);
          local_168._0_8_ = local_1f0._0_8_;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_168._24_8_ = local_1e0._8_8_;
            local_168._0_8_ = (PyTypeObject *)(local_168 + 0x10);
          }
          local_168._16_8_ = local_1e0._0_8_;
          local_168._8_8_ = local_1f0._8_8_;
          uVar30 = (getattrfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            uVar30 = local_1b0.field_2._M_allocated_capacity;
          }
          p_Var1 = (getattrfunc)((long)(binaryfunc *)local_1f0._8_8_ + local_1b0._M_string_length);
          if ((ulong)uVar30 < p_Var1) {
            p_Var31 = (getattrfunc)0xf;
            if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
              p_Var31 = (getattrfunc)local_1e0._0_8_;
            }
            if (p_Var31 < p_Var1) goto LAB_001360b8;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_168,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
          }
          else {
LAB_001360b8:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1b0,local_168._0_8_);
          }
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar23) {
            local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1d0.field_2._8_8_ = puVar13[3];
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1d0._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_1d0._M_string_length = puVar13[1];
          *puVar13 = paVar23;
          puVar13[1] = 0;
          paVar23->_M_local_buf[0] = '\0';
          std::__cxx11::string::_M_append(local_108,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          pybind11::handle::dec_ref(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
          }
          pybind11::handle::dec_ref((handle *)(local_120 + 8));
          p_Var28 = (freefunc)0x0;
        }
        else {
          pPVar22 = ptVar14->type;
          local_120._0_8_ = "__module__";
          local_120._8_8_ = (richcmpfunc)0x0;
          local_130._8_8_ = pPVar22;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_130)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar15,handle);
          local_188._0_8_ = local_188 + 0x10;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_188._24_8_ = local_1e0._8_8_;
          }
          else {
            local_188._0_8_ = local_1f0._0_8_;
          }
          local_188._16_8_ = local_1e0._0_8_;
          local_188._8_8_ = local_1f0._8_8_;
          plVar12 = (long *)std::__cxx11::string::append(local_188);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar23) {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1b0.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1b0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1b0._M_string_length = plVar12[1];
          *plVar12 = (long)paVar23;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_b8 = "__qualname__";
          local_b0.m_ptr = (PyObject *)0x0;
          local_c8._8_8_ = pPVar22;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1f0,pdVar15,handle_01);
          local_168._0_8_ = local_1f0._0_8_;
          if ((PyTypeObject *)local_1f0._0_8_ == (PyTypeObject *)local_1e0) {
            local_168._24_8_ = local_1e0._8_8_;
            local_168._0_8_ = (PyTypeObject *)(local_168 + 0x10);
          }
          local_168._16_8_ = local_1e0._0_8_;
          local_168._8_8_ = local_1f0._8_8_;
          uVar30 = (getattrfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            uVar30 = local_1b0.field_2._M_allocated_capacity;
          }
          p_Var1 = (getattrfunc)((long)(binaryfunc *)local_1f0._8_8_ + local_1b0._M_string_length);
          if ((ulong)uVar30 < p_Var1) {
            p_Var31 = (getattrfunc)0xf;
            if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
              p_Var31 = (getattrfunc)local_1e0._0_8_;
            }
            if (p_Var31 < p_Var1) goto LAB_00135dc9;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_168,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
          }
          else {
LAB_00135dc9:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1b0,local_168._0_8_);
          }
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar23) {
            local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1d0.field_2._8_8_ = puVar13[3];
          }
          else {
            local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1d0._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_1d0._M_string_length = puVar13[1];
          *puVar13 = paVar23;
          puVar13[1] = 0;
          paVar23->_M_local_buf[0] = '\0';
          std::__cxx11::string::_M_append(local_108,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          pybind11::handle::dec_ref(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_188._0_8_ != (PyTypeObject *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
          }
          pybind11::handle::dec_ref((handle *)(local_120 + 8));
        }
      }
      else {
        if (bVar2 == 0) break;
LAB_00135bde:
        std::__cxx11::string::push_back((char)local_108);
      }
    }
    else if (bVar2 == 0x7b) {
      bVar5 = true;
      if (((byte *)text)[1] != 0x2a) {
        if (((local_190->field_0x59 & 0x40) == 0) &&
           (p_Var28 == (freefunc)(ulong)local_190->nargs_pos)) {
          std::__cxx11::string::append(local_108);
        }
        paVar35 = (local_190->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((p_Var28 < (freefunc)
                        ((long)(local_190->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar35 >> 5)) &&
            (*(long *)(paVar35 + (long)p_Var28 * 0x20) != 0)) ||
           ((*(ushort *)&local_190->field_0x59 & 0x10) != 0 && p_Var28 == (freefunc)0x0)) {
          std::__cxx11::string::append(local_108);
        }
        else {
          uVar37 = (long)p_Var28 - (ulong)((*(ushort *)&local_190->field_0x59 >> 4 & 1) != 0);
          cVar29 = '\x01';
          if (9 < uVar37) {
            uVar24 = uVar37;
            cVar8 = '\x04';
            do {
              cVar29 = cVar8;
              if (uVar24 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_001361cc;
              }
              if (uVar24 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_001361cc;
              }
              if (uVar24 < 10000) goto LAB_001361cc;
              bVar5 = 99999 < uVar24;
              uVar24 = uVar24 / 10000;
              cVar8 = cVar29 + '\x04';
            } while (bVar5);
            cVar29 = cVar29 + '\x01';
          }
LAB_001361cc:
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1d0,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1d0._M_dataplus._M_p,(uint)local_1d0._M_string_length,uVar37);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x14ab5f);
          local_1f0._0_8_ = local_1e0;
          pPVar22 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar22) {
            local_1e0._0_8_ = (pPVar22->ob_base).ob_base.ob_refcnt;
            local_1e0._8_8_ = plVar12[3];
          }
          else {
            local_1e0._0_8_ = (pPVar22->ob_base).ob_base.ob_refcnt;
            local_1f0._0_8_ = (PyTypeObject *)*plVar12;
          }
          local_1f0._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar22;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append(local_108,local_1f0._0_8_);
          if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append(local_108);
        bVar5 = false;
      }
    }
    else {
      if (bVar2 != 0x7d) goto LAB_00135bde;
      if (((!bVar5) &&
          (paVar35 = (local_190->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          p_Var28 < (freefunc)
                    ((long)(local_190->args).
                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar35 >> 5))) &&
         (*(long *)(paVar35 + (long)p_Var28 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append(local_108);
        detail::replace_newlines_and_squash_abi_cxx11_
                  ((string *)local_1f0,
                   *(detail **)
                    ((local_d0->
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     )._M_impl.super__Vector_impl_data._M_start + (long)p_Var28 * 0x20 + 8),text_00)
        ;
        std::__cxx11::string::_M_append(local_108,local_1f0._0_8_);
        if ((PyTypeObject *)local_1f0._0_8_ != (PyTypeObject *)local_1e0) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
        }
      }
      if (((freefunc)(ulong)local_190->nargs_pos_only != (freefunc)0x0) &&
         (p_Var28 + 1 == (freefunc)(ulong)local_190->nargs_pos_only)) {
        std::__cxx11::string::append(local_108);
      }
      if (!bVar5) {
        p_Var28 = p_Var28 + 1;
      }
    }
LAB_001362b3:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((p_Var28 !=
       local_a0 +
       (-(ulong)((*(ushort *)&local_190->field_0x59 >> 7 & 1) != 0) -
       (ulong)(*(ushort *)&local_190->field_0x59 >> 6 & 1))) ||
     (local_138[lVar32] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar11 = strdup_guard::operator()(&local_e8,(char *)local_108._0_8_);
  pfVar33 = local_190;
  local_190->signature = pcVar11;
  if ((local_190->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_190->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_d0);
  }
  pfVar33->nargs = (uint16_t)local_a0;
  pPVar18 = (pfVar33->sibling).m_ptr;
  if (pPVar18 != (PyObject *)0x0) {
    if (pPVar18->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar18 = (PyObject *)pPVar18[1].ob_refcnt;
      (pfVar33->sibling).m_ptr = pPVar18;
      if (pPVar18 == (PyObject *)0x0) goto LAB_001363ea;
    }
    if (pPVar18->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar9 = PyType_IsSubtype(pPVar18->ob_type,&PyCFunction_Type);
      pPVar18 = (pfVar33->sibling).m_ptr;
      if (iVar9 == 0) {
        if ((pPVar18 != (PyObject *)&_Py_NoneStruct) && (*pfVar33->name != '_')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,pfVar33->name,(allocator<char> *)local_188);
          std::operator+(&local_1d0,"Cannot overload existing non-function object \"",&local_1b0);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1d0);
          local_1f0._0_8_ = *plVar12;
          psVar26 = (size_type *)(plVar12 + 2);
          if ((size_type *)local_1f0._0_8_ == psVar26) {
            local_1e0._0_8_ = *psVar26;
            local_1e0._8_8_ = plVar12[3];
            local_1f0._0_8_ = local_1e0;
          }
          else {
            local_1e0._0_8_ = *psVar26;
          }
          local_1f0._8_8_ = plVar12[1];
          *plVar12 = (long)psVar26;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          pybind11_fail((string *)local_1f0);
        }
        goto LAB_001363ea;
      }
    }
    if ((((*(byte *)(pPVar18[1].ob_refcnt + 0x10) & 0x20) == 0) &&
        (pPVar22 = pPVar18[1].ob_type, pPVar22 != (PyTypeObject *)0x0)) &&
       ((pPVar22->ob_base).ob_base.ob_type == (PyTypeObject *)&PyCapsule_Type)) {
      local_1f0._0_8_ = pPVar22;
      pybind11::handle::inc_ref((handle *)local_1f0);
      pcVar11 = capsule::name((capsule *)local_1f0);
      if (pcVar11 == (char *)0x0) {
        pfVar20 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1f0);
        pfVar36 = (function_record *)0x0;
        if ((pfVar20->scope).m_ptr == (pfVar33->scope).m_ptr) {
          pfVar36 = pfVar20;
        }
      }
      else {
        pfVar36 = (function_record *)0x0;
      }
      pybind11::handle::dec_ref((handle *)local_1f0);
      if (pfVar36 != (function_record *)0x0) {
        local_140->bf_getbuffer = (getbufferproc)(pfVar33->sibling).m_ptr;
        pybind11::handle::inc_ref((handle *)local_140);
        uVar21 = *(ushort *)&pfVar33->field_0x59;
        if (((*(ushort *)&pfVar36->field_0x59 ^ uVar21) & 0x10) != 0) {
          iVar9 = 0x14b195;
          if ((uVar21 & 0x10) == 0) {
            iVar9 = 0x14ace1;
          }
          local_c8._0_8_ = &local_b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,iVar9,((uVar21 & 0x10) >> 3) + iVar9 + 6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,
                         "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
          plVar12 = (long *)std::__cxx11::string::append(local_168);
          local_130._0_8_ = *plVar12;
          plVar27 = plVar12 + 2;
          if ((long *)local_130._0_8_ == plVar27) {
            local_120._0_8_ = *plVar27;
            local_120._8_8_ = plVar12[3];
            local_130._0_8_ = local_120;
          }
          else {
            local_120._0_8_ = *plVar27;
          }
          local_130._8_8_ = plVar12[1];
          *plVar12 = (long)plVar27;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_50.obj.m_ptr = (local_190->scope).m_ptr;
          local_50.key = "__name__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          str::str<pybind11::detail::accessor_policies::str_attr>(&local_98,&local_50);
          str::operator_cast_to_string(&local_70,&local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,&local_70);
          plVar12 = (long *)std::__cxx11::string::append(local_188);
          local_1b0._M_dataplus._M_p = (pointer)*plVar12;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p == paVar23) {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_1b0.field_2._8_8_ = plVar12[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          }
          local_1b0._M_string_length = plVar12[1];
          *plVar12 = (long)paVar23;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,local_190->name,&local_141);
          std::operator+(&local_1d0,&local_1b0,&local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,&local_1d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          pybind11_fail((string *)local_1f0);
        }
        pfVar20 = pfVar36;
        if ((uVar21 >> 8 & 1) == 0) {
          do {
            pfVar25 = pfVar20;
            pfVar20 = pfVar25->next;
          } while (pfVar20 != (function_record *)0x0);
          pfVar20 = (local_a8->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (local_a8->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          pfVar25->next = pfVar20;
          if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          local_110 = local_1e0;
        }
        else {
          pfVar33->next = pfVar36;
          local_1f0._0_8_ =
               (((function *)&local_140->bf_getbuffer)->super_object).super_handle.m_ptr[1].ob_type;
          pybind11::handle::inc_ref((handle *)local_1f0);
          pfVar36 = (local_a8->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (local_a8->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          capsule::set_pointer((capsule *)local_1f0,pfVar36);
          if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pybind11::handle::dec_ref((handle *)local_1f0);
          pfVar36 = pfVar33;
        }
        pcVar11 = local_1e0;
        local_1f0._8_8_ = (PyObject *)0x0;
        local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
        local_1f0._0_8_ = pcVar11;
        if (DAT_0015c151 == 1) {
          std::__cxx11::string::append(local_1f0);
          std::__cxx11::string::append(local_1f0);
          pcVar11 = (char *)std::__cxx11::string::append(local_1f0);
        }
        uVar37 = 0;
        goto LAB_001365a8;
      }
    }
  }
LAB_001363ea:
  pPVar16 = (PyMethodDef *)operator_new(0x20);
  pfVar33->def = pPVar16;
  *(undefined8 *)&pPVar16->ml_flags = 0;
  pPVar16->ml_doc = (char *)0x0;
  pPVar16->ml_name = pfVar33->name;
  pPVar16->ml_meth = dispatcher;
  pPVar16->ml_flags = 3;
  pfVar36 = (local_a8->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  (local_a8->_M_t).
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (function_record *)0x0;
  capsule::capsule((capsule *)&local_1d0,pfVar36,(char *)0x0,
                   initialize_generic::anon_class_1_0_00000001::__invoke);
  if (local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_1b0._M_dataplus._M_p = (pointer)0x0;
  pPVar18 = (pfVar33->scope).m_ptr;
  if (pPVar18 != (PyObject *)0x0) {
    iVar9 = PyObject_HasAttrString(pPVar18,"__module__");
    if (iVar9 == 1) {
      local_1f0._8_8_ = (pfVar33->scope).m_ptr;
      local_1e0._0_8_ = "__module__";
      local_1e0._8_8_ = 0;
      poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1f0);
      local_188._0_8_ = (poVar17->super_handle).m_ptr;
      pybind11::handle::inc_ref((handle *)local_188);
      object::operator=((object *)&local_1b0,(object *)local_188);
      pybind11::handle::dec_ref((handle *)local_188);
      pybind11::handle::dec_ref((handle *)(local_1e0 + 8));
    }
    else {
      iVar9 = PyObject_HasAttrString((pfVar33->scope).m_ptr,"__name__");
      if (iVar9 == 1) {
        local_1f0._8_8_ = (pfVar33->scope).m_ptr;
        local_1e0._0_8_ = "__name__";
        local_1e0._8_8_ = 0;
        poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1f0);
        local_188._0_8_ = (poVar17->super_handle).m_ptr;
        pybind11::handle::inc_ref((handle *)local_188);
        object::operator=((object *)&local_1b0,(object *)local_188);
        pybind11::handle::dec_ref((handle *)local_188);
        pybind11::handle::dec_ref((handle *)(local_1e0 + 8));
      }
    }
  }
  pPVar18 = (PyObject *)
            PyCMethod_New(pfVar33->def,local_1d0._M_dataplus._M_p,local_1b0._M_dataplus._M_p,0);
  (((function *)&local_140->bf_getbuffer)->super_object).super_handle.m_ptr = pPVar18;
  if (pPVar18 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::handle::dec_ref((handle *)&local_1b0);
  pybind11::handle::dec_ref((handle *)&local_1d0);
  pcVar11 = local_1e0;
  local_1f0._8_8_ = (PyObject *)0x0;
  local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
  uVar37 = CONCAT71((int7)((ulong)local_108 >> 8),1);
  pfVar36 = pfVar33;
  local_1f0._0_8_ = pcVar11;
  local_110 = pcVar11;
LAB_001365a8:
  uVar34 = 0;
  local_138 = (type_info **)CONCAT44(local_138._4_4_,(int)CONCAT71((int7)((ulong)pcVar11 >> 8),1));
  local_d0 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              *)CONCAT44(local_d0._4_4_,(int)uVar37);
  do {
    if (DAT_0015c151 == 1) {
      if (0 < (int)uVar34) {
        std::__cxx11::string::push_back((char)local_1f0);
      }
      if ((char)uVar37 == '\0') {
        uVar34 = uVar34 + 1;
        __val = -uVar34;
        if (0 < (int)uVar34) {
          __val = uVar34;
        }
        __len = 1;
        if (9 < __val) {
          uVar37 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar10 = (uint)uVar37;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0013664d;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0013664d;
            }
            if (uVar10 < 10000) goto LAB_0013664d;
            uVar37 = uVar37 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0013664d:
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1b0,(char)__len - (char)((int)uVar34 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1b0._M_dataplus._M_p + (uVar34 >> 0x1f),__len,__val);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
        pfVar33 = local_190;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        uVar37 = (ulong)local_d0 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar23) {
          local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_1d0.field_2._8_8_ = puVar13[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_1d0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_1d0._M_string_length = puVar13[1];
        *puVar13 = paVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append(local_1f0,(ulong)local_1d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_1f0);
      std::__cxx11::string::append(local_1f0);
      std::__cxx11::string::push_back((char)local_1f0);
    }
    if (((pfVar36->doc != (char *)0x0) && (*pfVar36->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      cVar29 = (char)local_1f0;
      if (((DAT_0015c151 | (byte)local_138) & 1) == 0) {
        std::__cxx11::string::push_back(cVar29);
        local_138 = (type_info **)((ulong)local_138 & 0xffffffff00000000);
      }
      else {
        local_138 = (type_info **)
                    CONCAT44(local_138._4_4_,
                             CONCAT31((int3)((ulong)local_138 >> 8),(byte)local_138 & DAT_0015c151))
        ;
      }
      if ((DAT_0015c151 & 1) != 0) {
        std::__cxx11::string::push_back(cVar29);
      }
      std::__cxx11::string::append(local_1f0);
      if (DAT_0015c151 == 1) {
        std::__cxx11::string::push_back(cVar29);
      }
    }
    pfVar36 = pfVar36->next;
    if (pfVar36 == (function_record *)0x0) {
      pPVar18 = (((function *)&local_140->bf_getbuffer)->super_object).super_handle.m_ptr;
      free(*(void **)(pPVar18[1].ob_refcnt + 0x18));
      if ((PyObject *)local_1f0._8_8_ == (PyObject *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11 = strdup((char *)local_1f0._0_8_);
      }
      pcVar6 = local_110;
      *(char **)(pPVar18[1].ob_refcnt + 0x18) = pcVar11;
      if ((pfVar33->field_0x59 & 0x10) != 0) {
        pPVar19 = (PyObject *)
                  PyInstanceMethod_New
                            ((((function *)&local_140->bf_getbuffer)->super_object).super_handle.
                             m_ptr);
        (((function *)&local_140->bf_getbuffer)->super_object).super_handle.m_ptr = pPVar19;
        if (pPVar19 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar18->ob_refcnt = pPVar18->ob_refcnt + -1;
        if (pPVar18->ob_refcnt == 0) {
          _Py_Dealloc(pPVar18);
        }
      }
      if ((char *)local_1f0._0_8_ != pcVar6) {
        operator_delete((void *)local_1f0._0_8_,local_1e0._0_8_ + 1);
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,
                        CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1)
        ;
      }
      strdup_guard::~strdup_guard(&local_e8);
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += detail::replace_newlines_and_squash(rec->args[arg_index].descr);
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    signature += detail::quote_cpp_type_name(detail::clean_type_id(t->name()));
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                detail::get_function_record_capsule_name(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }